

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

Error * ot::commissioner::ActiveDatasetFromJson
                  (Error *__return_storage_ptr__,ActiveOperationalDataset *aDataset,string *aJson)

{
  pointer puVar1;
  Timestamp TVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  Timestamp TVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  char *from;
  bool bVar5;
  format_args args;
  Json json;
  writer write;
  undefined1 local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  pointer local_188;
  undefined1 local_180 [32];
  json_value local_160 [8];
  undefined1 local_158 [40];
  _Alloc_hider local_130;
  char local_120 [16];
  Channel local_110;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_108;
  pointer local_f0;
  pointer puStack_e8;
  pointer local_e0;
  pointer local_d8;
  pointer puStack_d0;
  pointer local_c8;
  pointer local_c0;
  pointer puStack_b8;
  pointer local_b0;
  uint16_t local_a8;
  pointer local_a0;
  pointer puStack_98;
  pointer local_90;
  uint16_t local_88;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  writer local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_60 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_60;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ActiveOperationalDataset::ActiveOperationalDataset((ActiveOperationalDataset *)local_158);
  TVar2._4_4_ = local_158._4_4_;
  TVar2._0_4_ = local_158._0_4_;
  aDataset->mActiveTimestamp = TVar2;
  puVar1 = (aDataset->mExtendedPanId).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->mExtendedPanId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_158._8_8_;
  (aDataset->mExtendedPanId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_158._16_8_;
  (aDataset->mExtendedPanId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_158._24_8_;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  local_158._24_8_ = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  aDataset->mPanId = local_158._32_2_;
  std::__cxx11::string::operator=((string *)&aDataset->mNetworkName,(string *)&local_130);
  aDataset->mChannel = local_110;
  local_198 = (undefined1  [8])
              (aDataset->mChannelMask).
              super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
  _Stack_190._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (aDataset->mChannelMask).
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = (aDataset->mChannelMask).
              super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (aDataset->mChannelMask).
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_108.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (aDataset->mChannelMask).
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_108.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (aDataset->mChannelMask).
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           *)local_198);
  puVar1 = (aDataset->mMeshLocalPrefix).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_f0;
  (aDataset->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puStack_e8;
  (aDataset->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_e0;
  local_e0 = (pointer)0x0;
  local_f0 = (pointer)0x0;
  puStack_e8 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (aDataset->mNetworkMasterKey).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = local_d8;
  (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puStack_d0;
  (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
  local_d8 = (pointer)0x0;
  puStack_d0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = local_c0;
  (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_b8;
  (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_b0;
  local_c0 = (pointer)0x0;
  puStack_b8 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (aDataset->mSecurityPolicy).mRotationTime = local_a8;
  puVar1 = (aDataset->mSecurityPolicy).mFlags.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->mSecurityPolicy).mFlags.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_a0;
  (aDataset->mSecurityPolicy).mFlags.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_98;
  (aDataset->mSecurityPolicy).mFlags.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_90;
  local_a0 = (pointer)0x0;
  puStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  aDataset->mPresentFlags = local_88;
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0);
  }
  if (local_c0 != (pointer)0x0) {
    operator_delete(local_c0);
  }
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8);
  }
  if (local_f0 != (pointer)0x0) {
    operator_delete(local_f0);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_108);
  if (local_130._M_p != local_120) {
    operator_delete(local_130._M_p);
  }
  if ((pointer)local_158._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_158._8_8_);
  }
  StripComments((string *)local_158,aJson);
  first._M_current._4_4_ = local_158._4_4_;
  first._M_current._0_4_ = local_158._0_4_;
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)local_198,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_158._8_8_ + first._M_current));
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)(local_180 + 0x18),(input_adapter *)local_198,(parser_callback_t *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((pointer)_Stack_190._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
  }
  if ((undefined1 *)CONCAT44(local_158._4_4_,local_158._0_4_) != local_158 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_158._4_4_,local_158._0_4_));
  }
  if (local_180[0x18] == null) {
    local_158._0_4_ = none_type;
    from = "Empty active operational dataset JSON";
    local_158._8_8_ = "Empty active operational dataset JSON";
    local_158._16_8_ = (pointer)0x25;
    local_158._24_8_ = (pointer)0x0;
    local_130._M_p = (char *)0x0;
    local_158._32_8_ = (format_string_checker<char> *)local_158;
    local_38.handler_ = (format_string_checker<char> *)local_158;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_0017171e:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_38,from,to);
        from = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",(format_string_checker<char> *)local_158);
        bVar5 = true;
      }
      else {
        to = from + 1;
        bVar5 = to != "";
        if (bVar5) {
          if (*to != '{') {
            pcVar4 = from + 2;
            do {
              to = pcVar4;
              bVar5 = to != "";
              if (to == "") goto LAB_0017171a;
              pcVar4 = to + 1;
            } while (*to != '{');
          }
          bVar5 = true;
        }
LAB_0017171a:
        if (bVar5) goto LAB_0017171e;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_38,from,"");
        bVar5 = false;
      }
    } while (bVar5);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_158;
    fmt::v10::vformat_abi_cxx11_
              (&local_80,(v10 *)"Empty active operational dataset JSON",(string_view)ZEXT816(0x25),
               args);
    local_198._0_4_ = 5;
    _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_190,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    __return_storage_ptr__->mCode = local_198._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&_Stack_190);
    if ((pointer)_Stack_190._M_pi != (pointer)local_180) {
      operator_delete(_Stack_190._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00171670;
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::ActiveOperationalDataset,_ot::commissioner::ActiveOperationalDataset,_0>
              ((ActiveOperationalDataset *)local_158,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)(local_180 + 0x18));
    TVar3._4_4_ = local_158._4_4_;
    TVar3._0_4_ = local_158._0_4_;
    aDataset->mActiveTimestamp = TVar3;
    puVar1 = (aDataset->mExtendedPanId).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->mExtendedPanId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_158._8_8_;
    (aDataset->mExtendedPanId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_158._16_8_;
    (aDataset->mExtendedPanId).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_158._24_8_;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = (pointer)0x0;
    local_158._24_8_ = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    aDataset->mPanId = local_158._32_2_;
    std::__cxx11::string::operator=((string *)&aDataset->mNetworkName,(string *)&local_130);
    aDataset->mChannel = local_110;
    local_198 = (undefined1  [8])
                (aDataset->mChannelMask).
                super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
    _Stack_190._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (aDataset->mChannelMask).
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_188 = (aDataset->mChannelMask).
                super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (aDataset->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_108.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (aDataset->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_108.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (aDataset->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_108.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
               *)local_198);
    puVar1 = (aDataset->mMeshLocalPrefix).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_f0;
    (aDataset->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_e8;
    (aDataset->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_e0;
    local_e0 = (pointer)0x0;
    local_f0 = (pointer)0x0;
    puStack_e8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = (aDataset->mNetworkMasterKey).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_d8;
    (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_d0;
    (aDataset->mNetworkMasterKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
    local_d8 = (pointer)0x0;
    puStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_c0;
    (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_b8;
    (aDataset->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_b0;
    local_c0 = (pointer)0x0;
    puStack_b8 = (pointer)0x0;
    local_b0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    (aDataset->mSecurityPolicy).mRotationTime = local_a8;
    puVar1 = (aDataset->mSecurityPolicy).mFlags.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->mSecurityPolicy).mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_a0;
    (aDataset->mSecurityPolicy).mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_98;
    (aDataset->mSecurityPolicy).mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_90;
    local_a0 = (pointer)0x0;
    puStack_98 = (pointer)0x0;
    local_90 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    aDataset->mPresentFlags = local_88;
    if (local_a0 != (pointer)0x0) {
      operator_delete(local_a0);
    }
    if (local_c0 != (pointer)0x0) {
      operator_delete(local_c0);
    }
    if (local_d8 != (pointer)0x0) {
      operator_delete(local_d8);
    }
    if (local_f0 != (pointer)0x0) {
      operator_delete(local_f0);
    }
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_108);
    if (local_130._M_p != local_120) {
      operator_delete(local_130._M_p);
    }
    local_80._M_dataplus._M_p = (pointer)local_158._8_8_;
    if ((pointer)local_158._8_8_ == (pointer)0x0) goto LAB_00171670;
  }
  operator_delete(local_80._M_dataplus._M_p);
LAB_00171670:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)(local_180 + 0x18));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy(local_160,local_180[0x18]);
  return __return_storage_ptr__;
}

Assistant:

Error ActiveDatasetFromJson(ActiveOperationalDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = ActiveOperationalDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty active operational dataset JSON");
        }
        else
        {
            aDataset = json;
        }

    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}